

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sutil.c
# Opt level: O0

void sinf_norm_error(int nrhs,SuperMatrix *X,float *xtrue)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  int local_48;
  int local_44;
  int j;
  int i;
  float *soln_work;
  float *Xmat;
  float xnorm;
  float err;
  DNformat *Xstore;
  float *xtrue_local;
  SuperMatrix *X_local;
  int nrhs_local;
  
  piVar1 = (int *)X->Store;
  lVar2 = *(long *)(piVar1 + 2);
  for (local_48 = 0; local_48 < nrhs; local_48 = local_48 + 1) {
    lVar3 = lVar2 + (long)(local_48 * *piVar1) * 4;
    Xmat._0_4_ = 0.0;
    Xmat._4_4_ = 0.0;
    for (local_44 = 0; local_44 < X->nrow; local_44 = local_44 + 1) {
      if (Xmat._4_4_ <= ABS(*(float *)(lVar3 + (long)local_44 * 4) - xtrue[local_44])) {
        Xmat._4_4_ = ABS(*(float *)(lVar3 + (long)local_44 * 4) - xtrue[local_44]);
      }
      if (Xmat._0_4_ <= ABS(*(float *)(lVar3 + (long)local_44 * 4))) {
        Xmat._0_4_ = ABS(*(float *)(lVar3 + (long)local_44 * 4));
      }
    }
    printf("||X - Xtrue||/||X|| = %e\n",(double)(Xmat._4_4_ / Xmat._0_4_));
  }
  return;
}

Assistant:

void sinf_norm_error(int nrhs, SuperMatrix *X, float *xtrue)
{
    DNformat *Xstore;
    float err, xnorm;
    float *Xmat, *soln_work;
    int i, j;

    Xstore = X->Store;
    Xmat = Xstore->nzval;

    for (j = 0; j < nrhs; j++) {
      soln_work = &Xmat[j*Xstore->lda];
      err = xnorm = 0.0;
      for (i = 0; i < X->nrow; i++) {
	err = SUPERLU_MAX(err, fabs(soln_work[i] - xtrue[i]));
	xnorm = SUPERLU_MAX(xnorm, fabs(soln_work[i]));
      }
      err = err / xnorm;
      printf("||X - Xtrue||/||X|| = %e\n", err);
    }
}